

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O1

vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> * __thiscall
hta::storage::file::Metric::get
          (vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *__return_storage_ptr__,
          Metric *this,TimePoint begin,TimePoint end,IntervalScope scope)

{
  size_type __n;
  pair<unsigned_long,_unsigned_long> pVar1;
  allocator_type local_19;
  
  pVar1 = find_index(this,begin,end,scope);
  __n = pVar1.second - (long)pVar1.first;
  if (__n == 0) {
    (__return_storage_ptr__->super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::vector
              (__return_storage_ptr__,__n,&local_19);
    File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
              (&this->file_raw_,(int)__return_storage_ptr__,(void *)pVar1.first,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TimeValue> Metric::get(TimePoint begin, TimePoint end, IntervalScope scope)
{
    auto [index_begin, index_end] = find_index(begin, end, scope);
    if (index_begin == index_end)
    {
        return {};
    }
    std::vector<TimeValue> result(index_end - index_begin);
    file_raw().read(result, index_begin);
    return result;
}